

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O3

void __thiscall IRBuilder::IRBuilder(IRBuilder *this,Func *func)

{
  JitArenaAllocator *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar5;
  Opnd **__s;
  ulong uVar6;
  size_t requestedBytes;
  
  this->seenLdStackArgPtr = false;
  this->expectApplyArg = false;
  this->seenProfiledBeginSwitch = false;
  this->m_func = func;
  (this->m_statementReader).m_startLocation = (byte *)0x0;
  (this->m_statementReader).m_statementMap = (SmallSpanSequence *)0x0;
  (this->m_statementReader).m_statementMapIter.accumulatedIndex = -1;
  (this->m_statementReader).m_statementMapIter.accumulatedSourceBegin = 0;
  (this->m_statementReader).m_statementMapIter.accumulatedBytecodeBegin = 0;
  *(undefined8 *)&(this->m_statementReader).m_statementMapIter.indexOfActualOffset = 0;
  *(undefined8 *)((long)&(this->m_statementReader).m_fullstatementMap + 4) = 0;
  *(undefined8 *)((long)&(this->m_statementReader).m_nextStatementBoundary + 4) = 0;
  (this->m_statementReader).m_startOfStatement = true;
  this->handlerOffsetStack =
       (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
        *)0x0;
  (this->m_switchAdapter).super_SwitchAdapter._vptr_SwitchAdapter =
       (_func_int **)&PTR_AddBranchInstr_014d87c0;
  (this->m_switchAdapter).m_builder = this;
  (this->m_switchBuilder).m_adapter = &(this->m_switchAdapter).super_SwitchAdapter;
  (this->m_switchBuilder).m_seenOnlySingleCharStrCaseNodes = true;
  (this->m_switchBuilder).m_isAsmJs = false;
  (this->m_switchBuilder).m_switchOptBuildBail = false;
  (this->m_switchBuilder).m_switchIntDynProfile = false;
  (this->m_switchBuilder).m_switchStrDynProfile = false;
  (this->m_switchBuilder).m_profiledSwitchInstr = (Instr *)0x0;
  this->m_ldSlots = (BVFixed *)0x0;
  this->finallyBlockLevel = 0;
  this->m_callsOnStack = 0;
  this->m_argsOnStack = 0;
  this->m_paramScopeDone = false;
  this->callTreeHasSomeProfileInfo = false;
  this->m_loopCounterSym = (StackSym *)0x0;
  this->m_stackFuncPtrSym = (StackSym *)0x0;
  this->m_usedAsTemp = (BVFixed *)0x0;
  this->m_loopBodyRetIPSym = (StackSym *)0x0;
  this->m_saveLoopImplicitCallFlags = (Opnd **)0x0;
  this->m_loopBodyForInEnumeratorArrayOpnd = (RegOpnd *)0x0;
  this->longBranchMap = (LongBranchMap *)0x0;
  GeneratorJumpTable::GeneratorJumpTable(&this->m_generatorJumpTable,func,this);
  this_01 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  uVar3 = JITTimeFunctionBody::GetLoopCount(this_01);
  if (uVar3 != 0) {
    this_00 = func->m_alloc;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0042b430;
      *puVar5 = 0;
    }
    uVar6 = (ulong)uVar3;
    requestedBytes = uVar6 * 8;
    __s = (Opnd **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)this_00,requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar6,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar6 * -8);
    if (__s == (Opnd **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0042b430:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    this->m_saveLoopImplicitCallFlags = __s;
  }
  JITTimeWorkItem::InitializeReader
            (func->m_workItem,&this->m_jnReader,&this->m_statementReader,
             &func->m_alloc->super_ArenaAllocator);
  return;
}

Assistant:

IRBuilder(Func * func)
        : m_func(func)
        , m_argsOnStack(0)
        , m_loopBodyRetIPSym(nullptr)
        , m_ldSlots(nullptr)
        , m_loopCounterSym(nullptr)
        , callTreeHasSomeProfileInfo(false)
        , finallyBlockLevel(0)
        , m_saveLoopImplicitCallFlags(nullptr)
        , handlerOffsetStack(nullptr)
        , m_switchAdapter(this)
        , m_switchBuilder(&m_switchAdapter)
        , m_stackFuncPtrSym(nullptr)
        , m_loopBodyForInEnumeratorArrayOpnd(nullptr)
        , m_paramScopeDone(false)
#if DBG
        , m_callsOnStack(0)
        , m_usedAsTemp(nullptr)
#endif
#ifdef BAILOUT_INJECTION
        , seenLdStackArgPtr(false)
        , expectApplyArg(false)
        , seenProfiledBeginSwitch(false)
#endif
#ifdef BYTECODE_BRANCH_ISLAND
        , longBranchMap(nullptr)
#endif
        , m_generatorJumpTable(GeneratorJumpTable(func, this))
    {
        auto loopCount = func->GetJITFunctionBody()->GetLoopCount();
        if (loopCount > 0) {
#if DBG
            m_saveLoopImplicitCallFlags = AnewArrayZ(func->m_alloc, IR::Opnd*, loopCount);
#else
            m_saveLoopImplicitCallFlags = AnewArray(func->m_alloc, IR::Opnd*, loopCount);
#endif
        }

        // Note: use original byte code without debugging probes, so that we don't jit BPs inserted by the user.
        func->m_workItem->InitializeReader(&m_jnReader, &m_statementReader, func->m_alloc);
    }